

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.h
# Opt level: O1

void __thiscall
leveldb::VersionEdit::AddFile
          (VersionEdit *this,int level,uint64_t file,uint64_t file_size,InternalKey *smallest,
          InternalKey *largest)

{
  FileMetaData f;
  int local_dc;
  undefined1 local_d8 [24];
  _Alloc_hider local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  pair<int,_leveldb::FileMetaData> local_80;
  
  local_d8._0_4_ = 0;
  local_d8._4_4_ = 0x40000000;
  local_b8 = 0;
  local_b0._M_local_buf[0] = '\0';
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_dc = level;
  local_d8._8_8_ = file;
  local_d8._16_8_ = file_size;
  local_c0._M_p = (pointer)&local_b0;
  local_a0._M_p = (pointer)&local_90;
  std::__cxx11::string::_M_assign((string *)&local_c0);
  std::__cxx11::string::_M_assign((string *)&local_a0);
  std::pair<int,_leveldb::FileMetaData>::pair<int_&,_leveldb::FileMetaData_&,_true>
            (&local_80,&local_dc,(FileMetaData *)local_d8);
  std::
  vector<std::pair<int,leveldb::FileMetaData>,std::allocator<std::pair<int,leveldb::FileMetaData>>>
  ::emplace_back<std::pair<int,leveldb::FileMetaData>>
            ((vector<std::pair<int,leveldb::FileMetaData>,std::allocator<std::pair<int,leveldb::FileMetaData>>>
              *)&this->new_files_,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.second.largest.rep_._M_dataplus._M_p != &local_80.second.largest.rep_.field_2) {
    operator_delete(local_80.second.largest.rep_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.second.smallest.rep_._M_dataplus._M_p != &local_80.second.smallest.rep_.field_2) {
    operator_delete(local_80.second.smallest.rep_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_p != &local_90) {
    operator_delete(local_a0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_p != &local_b0) {
    operator_delete(local_c0._M_p);
  }
  return;
}

Assistant:

void AddFile(int level, uint64_t file, uint64_t file_size,
               const InternalKey& smallest, const InternalKey& largest) {
    FileMetaData f;
    f.number = file;
    f.file_size = file_size;
    f.smallest = smallest;
    f.largest = largest;
    new_files_.push_back(std::make_pair(level, f));
  }